

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9219d::PedestrianPlugIn::printMiniHelpForFunctionKeys(PedestrianPlugIn *this)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  ostringstream message;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
  std::operator<<((ostream *)&message,"Function keys handled by ");
  poVar2 = std::operator<<((ostream *)&message,'\"');
  iVar1 = (*(this->super_PlugIn).super_AbstractPlugIn._vptr_AbstractPlugIn[7])(this);
  poVar2 = std::operator<<(poVar2,(char *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,'\"');
  poVar2 = std::operator<<(poVar2,':');
  std::ends<char,std::char_traits<char>>(poVar2);
  OpenSteer::OpenSteerDemo::printMessage(&message);
  OpenSteer::OpenSteerDemo::printMessage(&message);
  OpenSteer::OpenSteerDemo::printMessage("  F1     add a pedestrian to the crowd.");
  OpenSteer::OpenSteerDemo::printMessage("  F2     remove a pedestrian from crowd.");
  OpenSteer::OpenSteerDemo::printMessage("  F3     use next proximity database.");
  OpenSteer::OpenSteerDemo::printMessage("  F4     toggle directed path follow.");
  OpenSteer::OpenSteerDemo::printMessage("  F5     toggle wander component on/off.");
  OpenSteer::OpenSteerDemo::printMessage("");
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
  return;
}

Assistant:

void printMiniHelpForFunctionKeys (void)
        {
            std::ostringstream message;
            message << "Function keys handled by ";
            message << '"' << name() << '"' << ':' << std::ends;
            OpenSteerDemo::printMessage (message);
            OpenSteerDemo::printMessage (message);
            OpenSteerDemo::printMessage ("  F1     add a pedestrian to the crowd.");
            OpenSteerDemo::printMessage ("  F2     remove a pedestrian from crowd.");
            OpenSteerDemo::printMessage ("  F3     use next proximity database.");
            OpenSteerDemo::printMessage ("  F4     toggle directed path follow.");
            OpenSteerDemo::printMessage ("  F5     toggle wander component on/off.");
            OpenSteerDemo::printMessage ("");
        }